

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

void R_Subsector(subsector_t *sub)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  sector_t *psVar4;
  FMiniBSP *pFVar5;
  secplane_t *psVar6;
  F3DFloor *pFVar7;
  double dVar8;
  undefined1 auVar9 [16];
  DWORD lightlevel;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar13;
  DWORD DVar14;
  FTextureID FVar15;
  unsigned_short uVar16;
  uint uVar17;
  FSectorPortal *pFVar18;
  lightlist_t *plVar19;
  extsector_t *peVar20;
  int iVar21;
  DWORD DVar22;
  long lVar23;
  subsector_t *psVar24;
  seg_t *line;
  long lVar25;
  ulong uVar26;
  double dVar27;
  int ceilinglightlevel;
  int floorlightlevel;
  sector_t tempsec;
  code *pcStackY_2d0;
  DWORD local_2bc;
  DWORD local_2b8;
  DWORD local_2b4;
  subsector_t *local_2b0;
  visplane_t *local_2a8 [2];
  sector_t local_298;
  
  psVar24 = InSubsector;
  if ((InSubsector == (subsector_t *)0x0) &&
     (InSubsector = sub,
     (long)numsubsectors <= ((long)sub - (long)subsectors >> 5) * -0x5555555555555555)) {
    pcStackY_2d0 = (code *)0x300d16;
    I_Error("R_Subsector: ss %ti with numss = %i");
  }
  psVar4 = sub->sector;
  if (psVar4 != (sector_t *)0x0) {
    if (sub->polys == (FPolyNode *)0x0) {
      frontsector = psVar4;
      *(byte *)&psVar4->MoreFlags = (byte)psVar4->MoreFlags | 0x80;
      pcStackY_2d0 = (code *)0x300d8d;
      frontsector = R_FakeFlat(psVar4,&local_298,(int *)&local_2b8,(int *)&local_2bc,false);
      DVar14 = local_2b8;
      DVar22 = local_2bc;
      foggy = true;
      if ((level.fadeto == 0) && ((frontsector->ColorMap->Fade).field_0.d == 0)) {
        foggy = (bool)(((byte)level.flags & 8) >> 3);
      }
      r_actualextralight = extralight << 4;
      if (foggy != false) {
        r_actualextralight = 0;
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        pcStackY_2d0 = (code *)0x301bf0;
        plVar19 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
        basecolormap = plVar19->extra_colormap;
        if (plVar19->p_lightlevel != &frontsector->lightlevel) {
          local_2bc = (DWORD)*plVar19->p_lightlevel;
        }
      }
      else {
        basecolormap = frontsector->ColorMap;
      }
      pcStackY_2d0 = (code *)0x300e17;
      pFVar18 = sector_t::ValidatePortal(frontsector,1);
      dVar8 = ViewPos.Z * (frontsector->ceilingplane).normal.Z +
              ViewPos.Y * (frontsector->ceilingplane).normal.Y +
              ViewPos.X * (frontsector->ceilingplane).normal.X + (frontsector->ceilingplane).D;
      if ((((-1.52587890625e-05 <= dVar8) && (1.52587890625e-05 < dVar8)) ||
          ((pFVar18 != (FSectorPortal *)0x0 ||
           (frontsector->planes[1].Texture.texnum == skyflatnum.texnum)))) ||
         (((psVar4 = frontsector->heightsec, psVar4 != (sector_t *)0x0 &&
           ((psVar4->MoreFlags & 0x10) == 0)) &&
          (psVar4->planes[0].Texture.texnum == skyflatnum.texnum)))) {
        pcStackY_2d0 = (code *)0x300eb5;
        ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                   (FTextureID)frontsector->planes[1].Texture.texnum,
                                   r_actualextralight + local_2bc,frontsector->planes[1].alpha,
                                   SUB41((frontsector->planes[1].Flags & 4U) >> 2,0),
                                   &frontsector->planes[1].xform,frontsector->sky,pFVar18);
      }
      else {
        ceilingplane = (visplane_t *)0x0;
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        pcStackY_2d0 = (code *)0x301c55;
        plVar19 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
        basecolormap = plVar19->extra_colormap;
        if (plVar19->p_lightlevel != &frontsector->lightlevel) {
          local_2b8 = (DWORD)*plVar19->p_lightlevel;
        }
      }
      else {
        basecolormap = frontsector->ColorMap;
      }
      pcStackY_2d0 = (code *)0x300f38;
      pFVar18 = sector_t::ValidatePortal(frontsector,0);
      dVar8 = ViewPos.Z * (frontsector->floorplane).normal.Z +
              ViewPos.Y * (frontsector->floorplane).normal.Y +
              ViewPos.X * (frontsector->floorplane).normal.X + (frontsector->floorplane).D;
      if ((((-1.52587890625e-05 <= dVar8) && (1.52587890625e-05 < dVar8)) ||
          ((pFVar18 != (FSectorPortal *)0x0 ||
           (frontsector->planes[0].Texture.texnum == skyflatnum.texnum)))) ||
         (((psVar4 = frontsector->heightsec, psVar4 != (sector_t *)0x0 &&
           ((psVar4->MoreFlags & 0x10) == 0)) &&
          (psVar4->planes[1].Texture.texnum == skyflatnum.texnum)))) {
        pcStackY_2d0 = (code *)0x300fc2;
        floorplane = R_FindPlane(&frontsector->floorplane,
                                 (FTextureID)frontsector->planes[0].Texture.texnum,
                                 r_actualextralight + local_2b8,frontsector->planes[0].alpha,
                                 SUB41((frontsector->planes[0].Flags & 4U) >> 2,0),
                                 (FTransform *)frontsector,frontsector->sky,pFVar18);
      }
      else {
        floorplane = (visplane_t *)0x0;
      }
      if (((r_3dfloors.Value != 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
        local_2b4 = DVar22;
        local_2b0 = psVar24;
        local_2a8[0] = ceilingplane;
        peVar20 = frontsector->e;
        local_2a8[1] = floorplane;
        if (0 < (int)(peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count) {
          lVar25 = 0;
          do {
            fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar25]
            ;
            if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
               (psVar6 = (fakeFloor->bottom).plane,
               (psVar6->normal).Y == 0.0 && (psVar6->normal).X == 0.0)) {
              if ((fakeFloor->flags & 0x2c) != 0x20) {
                pcStackY_2d0 = (code *)0x3010ca;
                R_3D_AddHeight((fakeFloor->top).plane,frontsector);
              }
              if (((fakeFloor->flags & 8) != 0) &&
                 ((~fakeFloor->flags & 0x40400000) != 0 && (long)fakeFloor->alpha != 0)) {
                auVar9 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
                fakeAlpha = (int)(auVar9._8_8_ >> 7) - (auVar9._12_4_ >> 0x1f);
                if (0xffff < fakeAlpha) {
                  fakeAlpha = 0x10000;
                }
                if (fakeFloor->validcount != validcount) {
                  fakeFloor->validcount = validcount;
                  pcStackY_2d0 = (code *)0x30114c;
                  R_3D_NewClip();
                }
                psVar6 = (fakeFloor->top).plane;
                dVar8 = (frontsector->centerspot).X;
                dVar3 = (frontsector->centerspot).Y;
                dVar27 = ((psVar6->normal).Y * dVar3 + (psVar6->normal).X * dVar8 + psVar6->D) *
                         psVar6->negiC;
                if ((dVar27 < ViewPos.Z) &&
                   ((dVar3 * (frontsector->floorplane).normal.Y +
                    dVar8 * (frontsector->floorplane).normal.X + (frontsector->floorplane).D) *
                    (frontsector->floorplane).negiC < dVar27)) {
                  fake3D = 1;
                  pcStackY_2d0 = (code *)0x3011e3;
                  sector_t::operator=(&local_298,fakeFloor->model);
                  FVar15.texnum = local_298.planes[0].Texture.texnum;
                  psVar6 = (fakeFloor->top).plane;
                  local_298.floorplane.normal.Z = (psVar6->normal).Z;
                  local_298.floorplane.normal.Y = (psVar6->normal).Y;
                  local_298.floorplane.normal.X = (psVar6->normal).X;
                  local_298.floorplane.D = psVar6->D;
                  local_298.floorplane.negiC = psVar6->negiC;
                  psVar6 = (fakeFloor->bottom).plane;
                  local_298.ceilingplane.normal.Z = (psVar6->normal).Z;
                  local_298.ceilingplane.normal.Y = (psVar6->normal).Y;
                  local_298.ceilingplane.normal.X = (psVar6->normal).X;
                  local_298.ceilingplane.D = psVar6->D;
                  local_298.ceilingplane.negiC = psVar6->negiC;
                  if ((fakeFloor->flags & 0x40400000) == 0) {
                    local_298.planes[0].Texture.texnum = local_298.planes[1].Texture.texnum;
                    lVar23 = 1;
                    if (FVar15.texnum != local_298.planes[1].Texture.texnum) {
                      pcStackY_2d0 = (code *)0x301288;
                      sector_t::AdjustFloorClip(&local_298);
                    }
                  }
                  else {
                    lVar23 = 0;
                  }
                  frontsector = &local_298;
                  if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                    pcStackY_2d0 = (code *)0x3012c2;
                    plVar19 = P_GetPlaneLight(sub->sector,&local_298.floorplane,false);
                    basecolormap = plVar19->extra_colormap;
                    local_2b8 = (DWORD)*plVar19->p_lightlevel;
                  }
                  ceilingplane = (visplane_t *)0x0;
                  pcStackY_2d0 = (code *)0x301333;
                  floorplane = R_FindPlane(&frontsector->floorplane,
                                           (FTextureID)frontsector->planes[0].Texture.texnum,
                                           r_actualextralight + local_2b8,
                                           frontsector->planes[0].alpha,
                                           (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                           &frontsector->planes[lVar23].xform,frontsector->sky,
                                           (FSectorPortal *)0x0);
                  pcStackY_2d0 = (code *)0x301345;
                  R_FakeDrawLoop(sub);
                  fake3D = 0;
                  frontsector = sub->sector;
                }
              }
            }
            lVar25 = lVar25 + 1;
            peVar20 = frontsector->e;
          } while (lVar25 < (int)(peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                 Count);
        }
        peVar20 = frontsector->e;
        if ((peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
          uVar26 = 0;
          do {
            fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar26]
            ;
            if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
               (psVar6 = (fakeFloor->top).plane,
               (psVar6->normal).Y == 0.0 && (psVar6->normal).X == 0.0)) {
              if ((fakeFloor->flags & 0x2c) != 0x20) {
                pcStackY_2d0 = (code *)0x3013f7;
                R_3D_AddHeight((fakeFloor->bottom).plane,frontsector);
              }
              if (((fakeFloor->flags & 8) != 0) &&
                 ((fakeFloor->flags & 0x40400010) != 0x400010 && (long)fakeFloor->alpha != 0)) {
                auVar9 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
                fakeAlpha = (int)(auVar9._8_8_ >> 7) - (auVar9._12_4_ >> 0x1f);
                if (0xffff < fakeAlpha) {
                  fakeAlpha = 0x10000;
                }
                if (fakeFloor->validcount != validcount) {
                  fakeFloor->validcount = validcount;
                  pcStackY_2d0 = (code *)0x30147c;
                  R_3D_NewClip();
                }
                psVar6 = (fakeFloor->bottom).plane;
                dVar8 = (frontsector->centerspot).X;
                dVar3 = (frontsector->centerspot).Y;
                dVar27 = ((psVar6->normal).Y * dVar3 + (psVar6->normal).X * dVar8 + psVar6->D) *
                         psVar6->negiC;
                if ((ViewPos.Z < dVar27) &&
                   (dVar27 < (dVar3 * (frontsector->ceilingplane).normal.Y +
                             dVar8 * (frontsector->ceilingplane).normal.X +
                             (frontsector->ceilingplane).D) * (frontsector->ceilingplane).negiC)) {
                  fake3D = 2;
                  pcStackY_2d0 = (code *)0x301512;
                  sector_t::operator=(&local_298,fakeFloor->model);
                  psVar6 = (fakeFloor->top).plane;
                  local_298.floorplane.normal.Z = (psVar6->normal).Z;
                  local_298.floorplane.normal.Y = (psVar6->normal).Y;
                  local_298.floorplane.normal.X = (psVar6->normal).X;
                  local_298.floorplane.D = psVar6->D;
                  local_298.floorplane.negiC = psVar6->negiC;
                  psVar6 = (fakeFloor->bottom).plane;
                  local_298.ceilingplane.normal.Z = (psVar6->normal).Z;
                  local_298.ceilingplane.normal.Y = (psVar6->normal).Y;
                  local_298.ceilingplane.normal.X = (psVar6->normal).X;
                  local_298.ceilingplane.negiC = psVar6->negiC;
                  uVar17 = fakeFloor->flags & 0x40400000;
                  if (uVar17 == 0 || uVar17 == 0x40400000) {
                    local_298.planes[1].Texture.texnum = local_298.planes[0].Texture.texnum;
                  }
                  local_298.ceilingplane.D =
                       local_298.ceilingplane.normal.Z * 1.52587890625e-05 + psVar6->D;
                  frontsector = &local_298;
                  if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                    pcStackY_2d0 = (code *)0x30160b;
                    plVar19 = P_GetPlaneLight(sub->sector,&local_298.ceilingplane,false);
                    basecolormap = plVar19->extra_colormap;
                    local_2bc = (DWORD)*plVar19->p_lightlevel;
                  }
                  local_298.ceilingplane.D =
                       local_298.ceilingplane.normal.Z * -1.52587890625e-05 +
                       local_298.ceilingplane.D;
                  floorplane = (visplane_t *)0x0;
                  pcStackY_2d0 = (code *)0x3016a5;
                  ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                             (FTextureID)frontsector->planes[1].Texture.texnum,
                                             r_actualextralight + local_2bc,
                                             frontsector->planes[1].alpha,
                                             (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                             &frontsector->planes
                                              [uVar17 != 0 && uVar17 != 0x40400000].xform,
                                             frontsector->sky,(FSectorPortal *)0x0);
                  pcStackY_2d0 = (code *)0x3016b7;
                  R_FakeDrawLoop(sub);
                  fake3D = 0;
                  frontsector = sub->sector;
                }
              }
            }
            uVar26 = uVar26 + 1;
            peVar20 = frontsector->e;
          } while (uVar26 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
        }
        fakeFloor = (F3DFloor *)0x0;
        floorplane = local_2a8[1];
        ceilingplane = local_2a8[0];
        psVar24 = local_2b0;
        DVar22 = local_2b4;
      }
      basecolormap = frontsector->ColorMap;
      lightlevel = DVar14;
      if (frontsector->planes[1].Texture.texnum == skyflatnum.texnum) {
        lightlevel = DVar22;
      }
      pcStackY_2d0 = (code *)0x30176a;
      local_2bc = DVar22;
      local_2b8 = DVar14;
      R_AddSprites(sub->sector,lightlevel,(uint)FakeSide);
      uVar26 = ((long)sub - (long)subsectors >> 5) * -0x5555555555555555;
      if (((uint)uVar26 < (uint)numsubsectors) &&
         (uVar16 = ParticlesInSubsec.Array[uVar26 & 0xffffffff], uVar16 != 0xffff)) {
        iVar21 = ((local_2bc + local_2b8) - ((int)(local_2bc + local_2b8) >> 0x1f) >> 1) +
                 r_actualextralight;
        do {
          pcStackY_2d0 = (code *)0x3017ed;
          R_ProjectParticle(Particles + uVar16,sub->sector,iVar21 * -0x4000 + 0x3d0000,
                            (uint)FakeSide);
          uVar16 = Particles[uVar16].snext;
        } while (uVar16 != 0xffff);
      }
      DVar22 = sub->numlines;
      if (DVar22 != 0) {
        line = sub->firstline;
        local_2b0 = psVar24;
        do {
          if (((psVar24 != (subsector_t *)0x0) || (line->sidedef == (side_t *)0x0)) ||
             ((line->sidedef->Flags & 0x40) == 0)) {
            if (((r_3dfloors.Value != 0) && (line->backsector != (sector_t *)0x0)) &&
               ((frontsector->e != (extsector_t *)0x0 &&
                ((line->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count !=
                 0)))) {
              local_2a8[1] = floorplane;
              local_2a8[0] = ceilingplane;
              floorplane = (visplane_t *)0x0;
              ceilingplane = (visplane_t *)0x0;
              peVar20 = line->backsector->e;
              local_2b4 = DVar22;
              if ((peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
                uVar26 = 0;
                do {
                  pFVar7 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                           [uVar26];
                  if (((~pFVar7->flags & 9) == 0) &&
                     (psVar4 = pFVar7->model, psVar4 != (sector_t *)0x0)) {
                    fake3D = 4;
                    lVar25 = 0x38;
                    do {
                      *(undefined8 *)((long)&local_2b0 + lVar25) =
                           *(undefined8 *)((long)psVar4->planes + lVar25 + -0x18);
                      puVar1 = (undefined8 *)((long)psVar4->planes + lVar25 + -0x38);
                      uVar10 = *puVar1;
                      uVar11 = puVar1[1];
                      puVar1 = (undefined8 *)((long)psVar4->planes + lVar25 + -0x28);
                      uVar12 = puVar1[1];
                      *(undefined8 *)(&stack0xfffffffffffffd40 + lVar25) = *puVar1;
                      *(undefined8 *)((long)&local_2b8 + lVar25) = uVar12;
                      *(undefined8 *)((long)&pcStackY_2d0 + lVar25) = uVar10;
                      *(undefined8 *)(&stack0xfffffffffffffd38 + lVar25) = uVar11;
                      *(undefined8 *)((long)local_2a8 + lVar25) =
                           *(undefined8 *)((long)psVar4->planes + lVar25 + -0x10);
                      *(undefined8 *)((long)local_298.planes + lVar25 + -8) =
                           *(undefined8 *)((long)psVar4->planes + lVar25 + -8);
                      puVar2 = (undefined8 *)((long)&psVar4->planes[0].xform.xOffs + lVar25);
                      uVar10 = puVar2[1];
                      puVar1 = (undefined8 *)((long)&psVar4->planes[0].xform.baseyOffs + lVar25);
                      uVar11 = *puVar1;
                      uVar12 = puVar1[1];
                      *(undefined8 *)((long)&local_298.planes[0].xform.xOffs + lVar25) = *puVar2;
                      *(undefined8 *)((long)&local_298.planes[0].xform.yOffs + lVar25) = uVar10;
                      *(undefined8 *)((long)&local_298.planes[0].xform.baseyOffs + lVar25) = uVar11;
                      *(undefined8 *)((long)&local_298.planes[0].xform.xScale + lVar25) = uVar12;
                      lVar25 = lVar25 + 0x58;
                    } while (lVar25 != 0xe8);
                    local_298.floorplane.normal.Z = (psVar4->floorplane).normal.Z;
                    local_298.floorplane.normal.Y = (psVar4->floorplane).normal.Y;
                    local_298.floorplane.normal.X = (psVar4->floorplane).normal.X;
                    local_298.floorplane.D = (psVar4->floorplane).D;
                    local_298.floorplane.negiC = (psVar4->floorplane).negiC;
                    local_298.ceilingplane.normal.Z = (psVar4->ceilingplane).normal.Z;
                    local_298.ceilingplane.normal.Y = (psVar4->ceilingplane).normal.Y;
                    local_298.ceilingplane.normal.X = (psVar4->ceilingplane).normal.X;
                    local_298.ceilingplane.D = (psVar4->ceilingplane).D;
                    local_298.ceilingplane.negiC = (psVar4->ceilingplane).negiC;
                    local_298.ColorMap = psVar4->ColorMap;
                    aVar13 = (psVar4->SoundTarget).field_0;
                    local_298.seqType = psVar4->seqType;
                    local_298._278_2_ = *(undefined2 *)&psVar4->field_0x116;
                    local_298.sky = psVar4->sky;
                    local_298._272_4_ =
                         SUB84((ulong)*(undefined8 *)((long)&(psVar4->SoundTarget).field_0 + 4) >>
                               0x20,0);
                    local_298.SoundTarget.field_0._0_4_ = aVar13._0_4_;
                    local_298.SoundTarget.field_0._4_4_ = aVar13._4_4_;
                    local_298.SeqName.super_FName.Index = (FName)(psVar4->SeqName).super_FName.Index
                    ;
                    local_298.centerspot.Y = (psVar4->centerspot).Y;
                    local_298.centerspot.X = (psVar4->centerspot).X;
                    pcStackY_2d0 = (code *)0x301a3b;
                    fakeFloor = pFVar7;
                    memcpy(&local_298.validcount,&psVar4->validcount,0xa0);
                    local_298.damagetype.super_FName.Index =
                         (FName)(psVar4->damagetype).super_FName.Index;
                    pcStackY_2d0 = (code *)0x301a65;
                    memcpy(&local_298.damageamount,&psVar4->damageamount,0x94);
                    psVar6 = (pFVar7->top).plane;
                    local_298.floorplane.normal.Z = (psVar6->normal).Z;
                    local_298.floorplane.normal.Y = (psVar6->normal).Y;
                    local_298.floorplane.normal.X = (psVar6->normal).X;
                    local_298.floorplane.D = psVar6->D;
                    local_298.floorplane.negiC = psVar6->negiC;
                    psVar6 = (pFVar7->bottom).plane;
                    local_298.ceilingplane.normal.Z = (psVar6->normal).Z;
                    local_298.ceilingplane.normal.Y = (psVar6->normal).Y;
                    local_298.ceilingplane.normal.X = (psVar6->normal).X;
                    local_298.ceilingplane.D = psVar6->D;
                    local_298.ceilingplane.negiC = psVar6->negiC;
                    backsector = &local_298;
                    if (pFVar7->validcount != validcount) {
                      pFVar7->validcount = validcount;
                      pcStackY_2d0 = (code *)0x301afd;
                      R_3D_NewClip();
                    }
                    pcStackY_2d0 = (code *)0x301b05;
                    R_AddLine(line);
                  }
                  uVar26 = uVar26 + 1;
                  peVar20 = line->backsector->e;
                } while (uVar26 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Count);
              }
              fakeFloor = (F3DFloor *)0x0;
              fake3D = 0;
              floorplane = local_2a8[1];
              ceilingplane = local_2a8[0];
              psVar24 = local_2b0;
              DVar22 = local_2b4;
            }
            pcStackY_2d0 = (code *)0x301b71;
            R_AddLine(line);
          }
          DVar22 = DVar22 - 1;
          line = line + 1;
        } while (DVar22 != 0);
      }
    }
    else {
      if ((sub->BSP == (FMiniBSP *)0x0) || (sub->BSP->bDirty == true)) {
        pcStackY_2d0 = (code *)0x300d3f;
        subsector_t::BuildPolyBSP(sub);
      }
      pFVar5 = sub->BSP;
      uVar17 = (pFVar5->Nodes).Count;
      if (uVar17 == 0) {
        pcStackY_2d0 = (code *)0x300ec0;
        R_Subsector((pFVar5->Subsectors).Array);
      }
      else {
        pcStackY_2d0 = (code *)0x300d61;
        R_RenderBSPNode((pFVar5->Nodes).Array + (uVar17 - 1));
      }
    }
    if (psVar24 == (subsector_t *)0x0) {
      InSubsector = (subsector_t *)0x0;
    }
    return;
  }
  pcStackY_2d0 = R_RenderBSPNode;
  __assert_fail("sub->sector != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_bsp.cpp"
                ,0x42d,"void R_Subsector(subsector_t *)");
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}